

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O2

int remote_send_handle(harbor *h,uint32_t source,uint32_t destination,int type,int session,char *msg
                      ,size_t sz)

{
  int fd;
  int iVar1;
  skynet_context *context;
  harbor_msg_queue *queue;
  uint uVar2;
  undefined4 uVar3;
  remote_message_header cookie;
  
  uVar2 = destination >> 0x18;
  context = h->ctx;
  if (uVar2 == h->id) {
    skynet_send(context,source,destination,type | 0x10000,session,msg,sz);
  }
  else {
    fd = h->s[uVar2].fd;
    iVar1 = h->s[uVar2].status;
    cookie.source = source;
    cookie.session = session;
    if (fd == 0) {
      if (iVar1 == 4) {
        uVar3 = 0;
        skynet_send(context,destination,source,7,0,(void *)0x0,0);
        skynet_error(context,"Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",
                     (ulong)uVar2,(ulong)source,(ulong)destination,(ulong)(uint)session,
                     CONCAT44(uVar3,(int)sz));
        return 0;
      }
    }
    else if (iVar1 != 1) {
      cookie.destination = type << 0x18 | destination & 0xffffff;
      send_remote(context,fd,msg,sz,&cookie);
      return 0;
    }
    queue = h->s[uVar2].queue;
    if (queue == (harbor_msg_queue *)0x0) {
      queue = new_queue();
      h->s[uVar2].queue = queue;
    }
    cookie.destination = destination & 0xffffff | type << 0x18;
    push_queue(queue,msg,sz,&cookie);
  }
  return 1;
}

Assistant:

static int
remote_send_handle(struct harbor *h, uint32_t source, uint32_t destination, int type, int session, const char * msg, size_t sz) {
	int harbor_id = destination >> HANDLE_REMOTE_SHIFT;
	struct skynet_context * context = h->ctx;
	if (harbor_id == h->id) {
		// local message
		skynet_send(context, source, destination , type | PTYPE_TAG_DONTCOPY, session, (void *)msg, sz);
		return 1;
	}

	struct slave * s = &h->s[harbor_id];
	if (s->fd == 0 || s->status == STATUS_HANDSHAKE) {
		if (s->status == STATUS_DOWN) {
			// throw an error return to source
			// report the destination is dead
			skynet_send(context, destination, source, PTYPE_ERROR, 0 , NULL, 0);
			skynet_error(context, "Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",harbor_id, source, destination,session,(int)sz);
		} else {
			if (s->queue == NULL) {
				s->queue = new_queue();
			}
			struct remote_message_header header;
			header.source = source;
			header.destination = (type << HANDLE_REMOTE_SHIFT) | (destination & HANDLE_MASK);
			header.session = (uint32_t)session;
			push_queue(s->queue, (void *)msg, sz, &header);
			return 1;
		}
	} else {
		struct remote_message_header cookie;
		cookie.source = source;
		cookie.destination = (destination & HANDLE_MASK) | ((uint32_t)type << HANDLE_REMOTE_SHIFT);
		cookie.session = (uint32_t)session;
		send_remote(context, s->fd, msg,sz,&cookie);
	}

	return 0;
}